

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SimpleArray<const_ON_SubDEdge_*> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chains)

{
  ON_SubDEdge *pOVar1;
  bool bVar2;
  ON_SubDEdgePtr *pOVar3;
  uint uVar4;
  ON_SubDEdge *pOVar5;
  ON_SubDEdgePtr *pOVar6;
  ON_SubDEdgePtr *pOVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ON_SubDEdge *edge;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong new_capacity;
  
  new_capacity = (ulong)(uint)edges->m_count;
  if (-1 < (long)edge_chains->m_capacity) {
    edge_chains->m_count = 0;
  }
  if ((ulong)(long)edge_chains->m_capacity < new_capacity) {
    ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(edge_chains,new_capacity);
  }
  if (new_capacity == 0) {
    uVar9 = 0;
  }
  else {
    uVar16 = 0;
    uVar9 = 0;
    uVar17 = 0;
    pOVar6 = (ON_SubDEdgePtr *)0x0;
    do {
      pOVar5 = edges->m_a[uVar16];
      pOVar3 = pOVar6;
      if (((pOVar5 != (ON_SubDEdge *)0x0) && (pOVar5->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
         (pOVar5->m_vertex[0] != pOVar5->m_vertex[1] && pOVar5->m_vertex[1] != (ON_SubDVertex *)0x0)
         ) {
        pOVar3 = ON_SimpleArray<ON_SubDEdgePtr>::AppendNew(edge_chains);
        pOVar3->m_ptr = (ON__UINT_PTR)pOVar5;
        bVar2 = true;
        if (pOVar6 != (ON_SubDEdgePtr *)0x0) {
          pOVar1 = (ON_SubDEdge *)pOVar6->m_ptr;
          uVar13 = (ulong)pOVar1 & 0xfffffffffffffff8;
          uVar4 = (uint)pOVar1;
          if (uVar13 == 0) {
            lVar12 = 0;
          }
          else {
            lVar12 = *(long *)(uVar13 + 0x80 + (ulong)(~uVar4 & 1) * 8);
          }
          uVar10 = (ulong)pOVar5 & 0xfffffffffffffff8;
          uVar8 = (uint)pOVar5;
          if (uVar10 == 0) {
            lVar14 = 0;
          }
          else {
            lVar14 = *(long *)(uVar10 + 0x80 + (ulong)(uVar8 & 1) * 8);
          }
          if (lVar12 == lVar14) {
            bVar2 = false;
          }
          else {
            if (uVar13 == 0) {
              lVar12 = 0;
              lVar14 = 0;
            }
            else {
              lVar12 = *(long *)(uVar13 + 0x80 + (ulong)(uVar4 & 1) * 8);
              lVar14 = *(long *)(uVar13 + 0x80 + (ulong)(~uVar4 & 1) * 8);
            }
            if (uVar10 == 0) {
              lVar15 = 0;
              lVar11 = 0;
            }
            else {
              lVar15 = *(long *)(uVar10 + 0x80 + (ulong)(uVar8 & 1) * 8);
              lVar11 = *(long *)(uVar10 + 0x80 + (ulong)(~uVar8 & 1) * 8);
            }
            pOVar7 = pOVar3;
            if (lVar14 != lVar11) {
              if (uVar17 != 1) goto LAB_005fa98f;
              pOVar5 = pOVar1;
              pOVar7 = pOVar6;
              if (lVar12 != lVar15) {
                if (lVar12 != lVar11) goto LAB_005fa98f;
                pOVar6->m_ptr = (ulong)pOVar1 & 0xfffffffffffffff9 ^ 1;
                pOVar5 = (ON_SubDEdge *)pOVar3->m_ptr;
                pOVar7 = pOVar3;
              }
            }
            pOVar7->m_ptr = (ulong)pOVar5 & 0xfffffffffffffff9 ^ 1;
            bVar2 = false;
          }
        }
LAB_005fa98f:
        uVar17 = uVar17 + 1;
        if (bVar2) {
          uVar9 = 1;
          uVar17 = 1;
        }
      }
      uVar16 = uVar16 + 1;
      pOVar6 = pOVar3;
    } while (new_capacity != uVar16);
  }
  return uVar9;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SimpleArray< const ON_SubDEdge* >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chains
)
{
  const unsigned count = edges.UnsignedCount();
  edge_chains.SetCount(0);
  edge_chains.Reserve(count);
  unsigned int chain_count = 0;
  unsigned chain_length = 0;
  ON_SubDEdgePtr* prev_eptr = nullptr;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = edges[i];
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;
    ON_SubDEdgePtr& eptr = edge_chains.AppendNew();
    eptr = ON_SubDEdgePtr::Create(e);
    if (nullptr != prev_eptr && prev_eptr->RelativeVertex(1) != eptr.RelativeVertex(0) )
    {
      const ON_SubDVertex* prev_v[2] = { prev_eptr->RelativeVertex(0), prev_eptr->RelativeVertex(1) };
      const ON_SubDVertex* v[2] = { eptr.RelativeVertex(0), eptr.RelativeVertex(1) };
      if (prev_v[1] == v[1])
        eptr = eptr.Reversed();
      else if (1 == chain_length)
      {
        if (prev_v[0] == v[0])
          *prev_eptr = prev_eptr->Reversed();
        else if (prev_v[0] == v[1])
        {
          *prev_eptr = prev_eptr->Reversed();
          eptr = eptr.Reversed();
        }
        else
          prev_eptr = nullptr;
      }
      else
        prev_eptr = nullptr;
    }

    if (nullptr == prev_eptr)
    {
      chain_count = 1;
      chain_length = 0;
    }
    prev_eptr = &eptr;
    ++chain_length;
  }
  return chain_count;
}